

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_redundancy_elimination.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::LocalRedundancyEliminationPass::EliminateRedundanciesInBB
          (LocalRedundancyEliminationPass *this,BasicBlock *block,ValueNumberTable *vnTable,
          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *value_to_ids)

{
  char cVar1;
  Instruction *pIVar2;
  Instruction *pIVar3;
  bool modified;
  undefined1 local_81;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_80;
  _Any_data *local_78;
  undefined8 uStack_70;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_81 = 0;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x20);
  *(LocalRedundancyEliminationPass **)local_58._M_unused._0_8_ = this;
  *(ValueNumberTable **)((long)local_58._M_unused._0_8_ + 8) = vnTable;
  *(undefined1 **)((long)local_58._M_unused._0_8_ + 0x10) = &local_81;
  *(map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    **)((long)local_58._M_unused._0_8_ + 0x18) = value_to_ids;
  pcStack_40 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/local_redundancy_elimination.cpp:44:15)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/local_redundancy_elimination.cpp:44:15)>
             ::_M_manager;
  uStack_70 = 0;
  pcStack_60 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:295:7)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:295:7)>
             ::_M_manager;
  pIVar3 = (block->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_78 = &local_58;
  if (pIVar3 != (Instruction *)0x0) {
    local_80._M_head_impl = pIVar3;
    std::
    _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/local_redundancy_elimination.cpp:44:15)>
    ::_M_invoke(&local_58,&local_80._M_head_impl);
  }
  pIVar3 = (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((pIVar3 != (Instruction *)0x0) &&
     ((pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    do {
      if (pIVar3 == (Instruction *)0x0) break;
      pIVar2 = (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      local_80._M_head_impl = pIVar3;
      if (local_68 == (code *)0x0) {
        std::__throw_bad_function_call();
      }
      if ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar2 = (Instruction *)0x0;
      }
      cVar1 = (*pcStack_60)(&local_78,&local_80);
      pIVar3 = pIVar2;
    } while (cVar1 != '\0');
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  return (bool)local_81;
}

Assistant:

bool LocalRedundancyEliminationPass::EliminateRedundanciesInBB(
    BasicBlock* block, const ValueNumberTable& vnTable,
    std::map<uint32_t, uint32_t>* value_to_ids) {
  bool modified = false;

  auto func = [this, &vnTable, &modified, value_to_ids](Instruction* inst) {
    if (inst->result_id() == 0) {
      return;
    }

    uint32_t value = vnTable.GetValueNumber(inst);

    if (value == 0) {
      return;
    }

    auto candidate = value_to_ids->insert({value, inst->result_id()});
    if (!candidate.second) {
      context()->KillNamesAndDecorates(inst);
      context()->ReplaceAllUsesWith(inst->result_id(), candidate.first->second);
      context()->KillInst(inst);
      modified = true;
    }
  };
  block->ForEachInst(func);
  return modified;
}